

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void SequentializeParallelCopy(VmModule *module,VmInstruction *p)

{
  SmallArray<VmValue_*,_4U> *this;
  char *pcVar1;
  bool bVar2;
  VmValue **ppVVar3;
  VmInstruction *pVVar4;
  VmInstruction *replacement;
  uint uVar5;
  VmValue *pVVar6;
  VmValue *pVVar7;
  VmValue *pVVar8;
  VmValue *in_R8;
  uint argumentPos;
  uint uVar9;
  uint uVar10;
  VmType type;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  
  this = &p->arguments;
  uVar10 = (p->arguments).count;
  do {
    do {
      if (uVar10 == 0) {
        return;
      }
      uVar9 = 0;
      bVar2 = false;
      while (uVar9 < uVar10) {
        ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,uVar9);
        pVVar6 = *ppVVar3;
        if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 2)) {
          pVVar6 = (VmValue *)0x0;
        }
        uVar10 = uVar9 + 1;
        ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,uVar10);
        pVVar4 = (VmInstruction *)*ppVVar3;
        if ((pVVar4 == (VmInstruction *)0x0) || ((pVVar4->super_VmValue).typeID != 2)) {
          pVVar4 = (VmInstruction *)0x0;
        }
        uVar5 = *(uint *)(pVVar6[1].users.little + 7);
        if ((pVVar4->color == 0) || (pVVar4->color != uVar5)) {
          if (uVar5 == 0) {
            type.structType = (TypeBase *)pVVar4;
            type._0_8_ = (pVVar4->super_VmValue).type.structType;
            pVVar4 = anon_unknown.dwarf_11cad6::CreateMov
                               (module,*(SynBase **)&(pVVar4->super_VmValue).type,type,in_R8);
            pcVar1 = (pVVar6->comment).end;
            (pVVar4->super_VmValue).comment.begin = (pVVar6->comment).begin;
            (pVVar4->super_VmValue).comment.end = pcVar1;
            goto LAB_001a770d;
          }
          uVar5 = 0;
          do {
            if ((p->arguments).count <= uVar5) {
              type_00.structType = (TypeBase *)pVVar4;
              type_00._0_8_ = (pVVar4->super_VmValue).type.structType;
              pVVar4 = anon_unknown.dwarf_11cad6::CreateMov
                                 (module,*(SynBase **)&(pVVar4->super_VmValue).type,type_00,in_R8);
              pVVar4->color = *(uint *)(pVVar6[1].users.little + 7);
              pcVar1 = (pVVar6->comment).end;
              (pVVar4->super_VmValue).comment.begin = (pVVar6->comment).begin;
              (pVVar4->super_VmValue).comment.end = pcVar1;
              anon_unknown.dwarf_11cad6::ReplaceValueUsersWith
                        (module,pVVar6,&pVVar4->super_VmValue,(uint *)0x0);
              goto LAB_001a7714;
            }
            ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,uVar5 + 1);
            uVar5 = uVar5 + 2;
          } while (*(int *)((*ppVVar3)[1].users.little + 7) != *(int *)(pVVar6[1].users.little + 7))
          ;
          uVar9 = uVar9 + 2;
        }
        else {
LAB_001a770d:
          anon_unknown.dwarf_11cad6::ReplaceValueUsersWith
                    (module,pVVar6,&pVVar4->super_VmValue,(uint *)0x0);
LAB_001a7714:
          ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,uVar9);
          VmValue::RemoveUse(*ppVVar3,&p->super_VmValue);
          ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,uVar10);
          VmValue::RemoveUse(*ppVVar3,&p->super_VmValue);
          ppVVar3 = SmallArray<VmValue_*,_4U>::back(this);
          pVVar6 = *ppVVar3;
          ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,uVar10);
          *ppVVar3 = pVVar6;
          SmallArray<VmValue_*,_4U>::pop_back(this);
          ppVVar3 = SmallArray<VmValue_*,_4U>::back(this);
          pVVar6 = *ppVVar3;
          ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,uVar9);
          *ppVVar3 = pVVar6;
          SmallArray<VmValue_*,_4U>::pop_back(this);
          bVar2 = true;
        }
        uVar10 = (p->arguments).count;
      }
    } while (bVar2);
    ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,0);
    pVVar6 = *ppVVar3;
    if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 2)) {
      pVVar6 = (VmValue *)0x0;
    }
    ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,1);
    pVVar8 = *ppVVar3;
    if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 2)) {
      pVVar8 = (VmValue *)0x0;
    }
    uVar10 = 0;
    do {
      if ((p->arguments).count <= uVar10) {
        pVVar7 = (VmValue *)0x0;
        break;
      }
      ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,uVar10 + 1);
      pVVar7 = *ppVVar3;
      uVar10 = uVar10 + 2;
    } while (*(int *)(pVVar7[1].users.little + 7) != *(int *)(pVVar6[1].users.little + 7));
    type_01.structType = (TypeBase *)pVVar7;
    type_01._0_8_ = (pVVar7->type).structType;
    pVVar4 = anon_unknown.dwarf_11cad6::CreateMov(module,*(SynBase **)&pVVar7->type,type_01,in_R8);
    pcVar1 = (pVVar7->comment).end;
    (pVVar4->super_VmValue).comment.begin = (pVVar7->comment).begin;
    (pVVar4->super_VmValue).comment.end = pcVar1;
    type_02.structType = (TypeBase *)pVVar8;
    type_02._0_8_ = (pVVar8->type).structType;
    replacement = anon_unknown.dwarf_11cad6::CreateMov
                            (module,*(SynBase **)&pVVar8->type,type_02,in_R8);
    replacement->color = *(uint *)(pVVar6[1].users.little + 7);
    pcVar1 = (pVVar6->comment).end;
    (replacement->super_VmValue).comment.begin = (pVVar6->comment).begin;
    (replacement->super_VmValue).comment.end = pcVar1;
    anon_unknown.dwarf_11cad6::ReplaceValueUsersWith
              (module,pVVar6,&replacement->super_VmValue,(uint *)0x0);
    ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,0);
    VmValue::RemoveUse(*ppVVar3,&p->super_VmValue);
    ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,1);
    VmValue::RemoveUse(*ppVVar3,&p->super_VmValue);
    ppVVar3 = SmallArray<VmValue_*,_4U>::back(this);
    pVVar8 = *ppVVar3;
    ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,1);
    *ppVVar3 = pVVar8;
    SmallArray<VmValue_*,_4U>::pop_back(this);
    ppVVar3 = SmallArray<VmValue_*,_4U>::back(this);
    pVVar8 = *ppVVar3;
    ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,0);
    *ppVVar3 = pVVar8;
    SmallArray<VmValue_*,_4U>::pop_back(this);
    for (uVar9 = 1; uVar10 = (p->arguments).count, uVar9 - 1 < uVar10; uVar9 = uVar9 + 2) {
      ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,uVar9);
      pVVar8 = *ppVVar3;
      if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 2)) {
        pVVar8 = (VmValue *)0x0;
      }
      if (*(int *)(pVVar8[1].users.little + 7) == *(int *)(pVVar6[1].users.little + 7)) {
        ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](this,uVar9);
        *ppVVar3 = &pVVar4->super_VmValue;
        VmValue::RemoveUse(pVVar8,&p->super_VmValue);
        VmValue::AddUse(&pVVar4->super_VmValue,&p->super_VmValue);
      }
    }
  } while( true );
}

Assistant:

void SequentializeParallelCopy(VmModule *module, VmInstruction *p)
{
	while(!p->arguments.empty())
	{
		bool changed = false;

		// Handle leaf nodes
		for(unsigned argumentPos = 0; argumentPos < p->arguments.size();)
		{
			VmInstruction *b = getType<VmInstruction>(p->arguments[argumentPos]);
			VmInstruction *a = getType<VmInstruction>(p->arguments[argumentPos + 1]);

			bool remove = false;

			// If the colors are the same, no need to move
			if(a->color != 0 && a->color == b->color)
			{
				ReplaceValueUsersWith(module, b, a, NULL);

				remove = true;
			}

			// If the target has no fixed register, extract as a move
			if(!remove && b->color == 0)
			{
				VmInstruction *copy = CreateMov(module, NULL, a->type, a);

				copy->comment = b->comment;

				ReplaceValueUsersWith(module, b, copy, NULL);

				remove = true;
			}

			// If the target fixed register value is not read by other copies, we can extract is as move
			if(!remove && b->color != 0)
			{
				bool isRead = false;

				for(unsigned k = 0; k < p->arguments.size(); k += 2)
				{
					VmInstruction *read = getType<VmInstruction>(p->arguments[k + 1]);

					if(read->color == b->color)
					{
						isRead = true;
						break;
					}
				}

				if(!isRead)
				{
					VmInstruction *copy = CreateMov(module, NULL, a->type, a);

					copy->color = b->color;
					copy->comment = b->comment;

					ReplaceValueUsersWith(module, b, copy, NULL);

					remove = true;
				}
			}

			if(remove)
			{
				p->arguments[argumentPos]->RemoveUse(p);
				p->arguments[argumentPos + 1]->RemoveUse(p);

				p->arguments[argumentPos + 1] = p->arguments.back();
				p->arguments.pop_back();

				p->arguments[argumentPos] = p->arguments.back();
				p->arguments.pop_back();

				changed = true;
			}
			else
			{
				argumentPos += 2;
			}
		}

		if(!changed)
		{
			// Take the first copy to break the loop
			unsigned argumentPos = 0;

			VmInstruction *b = getType<VmInstruction>(p->arguments[argumentPos]);
			VmInstruction *a = getType<VmInstruction>(p->arguments[argumentPos + 1]);

			// Find current destination user
			VmInstruction *user = NULL;

			for(unsigned k = 0; k < p->arguments.size(); k += 2)
			{
				VmInstruction *a2 = getType<VmInstruction>(p->arguments[k + 1]);

				if(a2->color == b->color)
				{
					user = a2;
					break;
				}
			}

			// Create a new location for A (uncolored!)
			VmInstruction *backup = CreateMov(module, NULL, user->type, user);

			backup->comment = user->comment;

			// Create a copy
			VmInstruction *copy = CreateMov(module, NULL, a->type, a);

			copy->color = b->color;
			copy->comment = b->comment;

			ReplaceValueUsersWith(module, b, copy, NULL);

			// Remove argument
			p->arguments[argumentPos]->RemoveUse(p);
			p->arguments[argumentPos + 1]->RemoveUse(p);

			p->arguments[argumentPos + 1] = p->arguments.back();
			p->arguments.pop_back();

			p->arguments[argumentPos] = p->arguments.back();
			p->arguments.pop_back();

			// Replace all uses of original color with a copy
			for(unsigned k = 0; k < p->arguments.size(); k += 2)
			{
				VmInstruction *a2 = getType<VmInstruction>(p->arguments[k + 1]);

				if(a2->color == b->color)
				{
					p->arguments[k + 1] = backup;

					a2->RemoveUse(p);
					backup->AddUse(p);
				}
			}
		}
	}
}